

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_compile_commands.cxx
# Opt level: O0

int main(void)

{
  pointer pbVar1;
  bool bVar2;
  TranslationUnitsType *this;
  char *pcVar3;
  ostream *poVar4;
  reference pvVar5;
  duration<double,_std::ratio<1L,_1L>_> timeout;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  undefined1 local_2d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  CommandType *tu;
  const_iterator __end1;
  const_iterator __begin1;
  TranslationUnitsType *__range1;
  undefined1 local_290 [8];
  CompileCommandParser parser;
  ifstream file;
  
  std::ifstream::ifstream(&parser.Input,"compile_commands.json",_S_in);
  CompileCommandParser::CompileCommandParser
            ((CompileCommandParser *)local_290,(istream *)&parser.Input);
  CompileCommandParser::Parse((CompileCommandParser *)local_290);
  this = CompileCommandParser::GetTranslationUnits((CompileCommandParser *)local_290);
  __end1 = std::
           vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
           ::begin(this);
  tu = (CommandType *)
       std::
       vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
       ::end(this);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_CompileCommandParser::CommandType_*,_std::vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>_>
                                *)&tu);
    if (!bVar2) {
      CompileCommandParser::~CompileCommandParser((CompileCommandParser *)local_290);
      std::ifstream::~ifstream(&parser.Input);
      return 0;
    }
    command.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_CompileCommandParser::CommandType_*,_std::vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>_>
                  ::operator*(&__end1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2d8);
    pbVar1 = command.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"command",&local_2f9);
    CompileCommandParser::CommandType::at((CommandType *)pbVar1,&local_2f8);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::ParseUnixCommandLine
              (pcVar3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2d8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator(&local_2f9);
    pbVar1 = command.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"directory",&local_321);
    CompileCommandParser::CommandType::at((CommandType *)pbVar1,&local_320);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    timeout = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
    bVar2 = cmSystemTools::RunSingleCommand
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2d8,(string *)0x0,(string *)0x0,(int *)0x0,pcVar3,OUTPUT_MERGE,
                       (cmDuration)timeout.__r,Auto);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator(&local_321);
    if (((bVar2 ^ 0xffU) & 1) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2d8);
    __gnu_cxx::
    __normal_iterator<const_CompileCommandParser::CommandType_*,_std::vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>_>
    ::operator++(&__end1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"ERROR: Failed to run command \"");
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_2d8,0);
  poVar4 = std::operator<<(poVar4,(string *)pvVar5);
  poVar4 = std::operator<<(poVar4,"\"");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

int main()
{
  cmsys::ifstream file("compile_commands.json");
  CompileCommandParser parser(file);
  parser.Parse();
  for (auto const& tu : parser.GetTranslationUnits()) {
    std::vector<std::string> command;
    cmSystemTools::ParseUnixCommandLine(tu.at("command").c_str(), command);
    if (!cmSystemTools::RunSingleCommand(command, nullptr, nullptr, nullptr,
                                         tu.at("directory").c_str())) {
      std::cout << "ERROR: Failed to run command \"" << command[0] << "\""
                << std::endl;
      exit(1);
    }
  }
  return 0;
}